

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

void __thiscall
SAT::analyze(SAT *this,int nodeid,
            set<int,_std::less<int>,_std::allocator<int>_> *contributingNogoods)

{
  LitSort __comp;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Lit *pLVar5;
  float *pfVar6;
  int *piVar7;
  Clause *elem;
  vec<Lit> *this_00;
  int in_ESI;
  SAT *in_RDI;
  float fVar8;
  int i;
  vec<Lit> out_learnt2;
  Clause *c;
  SAT *in_stack_000000a0;
  int btlevel;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_000000e8;
  SAT *in_stack_000000f0;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_00000270;
  int in_stack_0000027c;
  SAT *in_stack_00000280;
  undefined1 in_stack_000002c7;
  Clause *in_stack_000002c8;
  SAT *in_stack_000002d0;
  SAT *in_stack_ffffffffffffff38;
  Reason *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  Lit in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined1 learnt;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff78;
  SAT *in_stack_ffffffffffffff80;
  int local_68;
  Clause *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Reason local_40;
  int local_34;
  Clause *local_30;
  vec<int> *local_28;
  int local_1c;
  int local_c;
  
  local_c = in_ESI;
  iVar2 = decisionLevel((SAT *)0x297e00);
  in_RDI->avg_depth = ((double)iVar2 - in_RDI->avg_depth) * 0.01 + in_RDI->avg_depth;
  checkConflict((SAT *)CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50));
  varDecayActivity((SAT *)CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50));
  claDecayActivity((SAT *)CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50));
  getLearntClause(in_stack_00000280,in_stack_0000027c,in_stack_00000270);
  explainUnlearnable(in_stack_000000a0,(set<int,_std::less<int>,_std::allocator<int>_> *)c);
  if ((so.exhaustive_activity & 1U) != 0) {
    explainToExhaustion(in_stack_000000f0,in_stack_000000e8);
  }
  clearSeen((SAT *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  local_1c = findBackTrackLevel(in_RDI);
  iVar2 = decisionLevel((SAT *)0x297ebc);
  in_RDI->back_jumps = (long)((iVar2 + -1) - local_1c) + in_RDI->back_jumps;
  btToLevel((SAT *)CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50),
            (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  in_RDI->confl = (Clause *)0x0;
  if ((so.sort_learnt_level & 1U) != 0) {
    uVar3 = vec<Lit>::size(&in_RDI->out_learnt);
    if (3 < uVar3) {
      pLVar5 = ::vec::operator_cast_to_Lit_((vec *)&in_RDI->out_learnt);
      in_stack_ffffffffffffff80 = (SAT *)(pLVar5 + 2);
      in_stack_ffffffffffffff78._pt =
           (Clause *)::vec::operator_cast_to_Lit_((vec *)&in_RDI->out_learnt);
      vec<Lit>::size(&in_RDI->out_learnt);
      local_28 = (in_RDI->lit_sort).level;
      __comp.level._4_4_ = in_stack_ffffffffffffff64;
      __comp.level._0_4_ = in_stack_ffffffffffffff60;
      std::sort<Lit*,SAT::LitSort>
                ((Lit *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (Lit *)CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50),__comp);
    }
  }
  local_30 = ::Clause_new<vec<Lit>>
                       ((vec<Lit> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        SUB41((uint)in_stack_ffffffffffffff5c >> 0x18,0));
  fVar8 = (float)in_RDI->cla_inc;
  pfVar6 = Clause::activity(local_30);
  *pfVar6 = fVar8;
  piVar7 = Clause::rawActivity(local_30);
  *piVar7 = 1;
  piVar7 = Clause::clauseID(local_30);
  *piVar7 = local_c;
  Clause::size(local_30);
  learntLenBumpActivity(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  iVar2 = local_c;
  if ((so.learn & 1U) != 0) {
    uVar3 = Clause::size(local_30);
    iVar2 = local_c;
    if (1 < uVar3) {
      addClause(in_stack_000002d0,in_stack_000002c8,(bool)in_stack_000002c7);
      iVar2 = local_c;
    }
  }
  if ((so.learn & 1U) == 0) {
LAB_0029809a:
    vec<vec<Clause_*>_>::last(&in_RDI->rtrail);
    vec<Clause_*>::push((vec<Clause_*> *)
                        CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50),
                        (Clause **)in_stack_ffffffffffffff48);
  }
  else if ((so.bin_clause_opt & 1U) != 0) {
    uVar3 = Clause::size(local_30);
    if (uVar3 < 3) goto LAB_0029809a;
  }
  pLVar5 = vec<Lit>::operator[](&in_RDI->out_learnt,0);
  local_34 = pLVar5->x;
  if ((so.bin_clause_opt & 1U) != 0) {
    uVar3 = Clause::size(local_30);
    if (uVar3 == 2) {
      pLVar5 = vec<Lit>::operator[](&in_RDI->out_learnt,1);
      in_stack_ffffffffffffffbc = pLVar5->x;
      Reason::Reason(in_stack_ffffffffffffff48,in_stack_ffffffffffffff54);
      goto LAB_00298143;
    }
  }
  Reason::Reason(&local_40,local_30);
LAB_00298143:
  enqueue((SAT *)CONCAT44(iVar2,fVar8),(Lit)(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
          (Reason)in_stack_ffffffffffffff78);
  if ((so.ldsbad & 1U) != 0) {
    vec<Lit>::vec((vec<Lit> *)&stack0xffffffffffffffa8);
    vec<Lit>::operator[](&in_RDI->out_learnt,0);
    vec<Lit>::push((vec<Lit> *)CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50),
                   (Lit *)in_stack_ffffffffffffff48);
    local_68 = 0;
    while( true ) {
      learnt = (undefined1)((uint)in_stack_ffffffffffffff5c >> 0x18);
      iVar2 = local_68;
      iVar4 = decisionLevel((SAT *)0x2981bf);
      if (iVar4 <= iVar2) break;
      in_stack_ffffffffffffff5c = decisionLevel((SAT *)0x2981df);
      decLit(in_stack_ffffffffffffff38,0);
      in_stack_ffffffffffffff54 = operator~((Lit)0x298210);
      vec<Lit>::push((vec<Lit> *)CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50),
                     (Lit *)in_stack_ffffffffffffff48);
      local_68 = local_68 + 1;
    }
    elem = ::Clause_new<vec<Lit>>((vec<Lit> *)CONCAT44(iVar4,iVar2),(bool)learnt);
    local_30 = elem;
    this_00 = (vec<Lit> *)vec<vec<Clause_*>_>::last(&in_RDI->rtrail);
    vec<Clause_*>::push((vec<Clause_*> *)
                        CONCAT44(in_stack_ffffffffffffff54.x,in_stack_ffffffffffffff50),
                        (Clause **)elem);
    vec<Lit>::~vec(this_00);
  }
  if ((so.ldsb & 1U) != 0) {
    bVar1 = LDSB::processImpl((LDSB *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              in_stack_ffffffffffffffb0);
    if (!bVar1) {
      engine.async_fail = true;
    }
  }
  uVar3 = vec<Clause_*>::size(&in_RDI->learnts);
  if ((so.nof_learnts <= (int)uVar3) || ((long)(so.learnts_mlimit / 4) <= in_RDI->learnts_literals))
  {
    reduceDB(in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void SAT::analyze(int nodeid, std::set<int>& contributingNogoods) {
	avg_depth += 0.01 * (decisionLevel() - avg_depth);

	/* if (so.debug) { */
	/*   std::cerr << "trail:\n"; */
	/*   for (int i = 0 ; i < trail.size() ; i++) { */
	/*     std::cerr << "level " << i << ":"; */
	/*     for (int j = 0 ; j < trail[i].size() ; j++) { */
	/*       Lit& lit = trail[i][j]; */
	/*       std::cerr << " " << getLitString(toInt(lit)); */
	/*     } */
	/*     std::cerr << "\n"; */
	/*   } */
	/* } */

	checkConflict();
	varDecayActivity();
	claDecayActivity();
	getLearntClause(nodeid, contributingNogoods);
	explainUnlearnable(contributingNogoods);
	if (so.exhaustive_activity) {
		explainToExhaustion(contributingNogoods);
	}
	clearSeen();

	const int btlevel = findBackTrackLevel();
	back_jumps += decisionLevel() - 1 - btlevel;
	//	fprintf(stderr, "btlevel = %d\n", btlevel);
	btToLevel(btlevel);
	confl = nullptr;

	if (so.sort_learnt_level && out_learnt.size() >= 4) {
		std::sort((Lit*)out_learnt + 2, (Lit*)out_learnt + out_learnt.size(), lit_sort);
	}

#if DEBUG_VERBOSE
	std::cerr << "out_learnt:";
	for (int i = 0; i < out_learnt.size(); i++) {
		std::cerr << " " << toInt(out_learnt[i]);
	}
	std::cerr << "\n";
	std::cerr << "out_learnt (interpreted):";
	for (int i = 0; i < out_learnt.size(); i++) {
		std::cerr << " " << litString[toInt(out_learnt[i])];
	}
	std::cerr << "\n";
#endif

	Clause* c = Clause_new(out_learnt, true);
	c->activity() = static_cast<float>(cla_inc);
	c->rawActivity() = 1;
	c->clauseID() = nodeid;

	learntLenBumpActivity(c->size());

	/* std::cerr << "conflict found clause of length " << c->size() << "\n"; */

	/* if (c->size() == 1) { */
	/*     std::cerr << "learntfact: " << getLitString(toInt((*c)[0])) << "\n"; */
	/* } */

	if (so.learn && c->size() >= 2) {
		addClause(*c, so.one_watch);
	}

	if (!so.learn || (so.bin_clause_opt && c->size() <= 2)) {
		rtrail.last().push(c);
	}

	enqueue(out_learnt[0], (so.bin_clause_opt && c->size() == 2) ? Reason(out_learnt[1]) : c);

	if (PRINT_ANALYSIS) {
		printClause(*c);
	}

	if (so.ldsbad) {
		vec<Lit> out_learnt2;
		out_learnt2.push(out_learnt[0]);
		for (int i = 0; i < decisionLevel(); i++) {
			out_learnt2.push(~decLit(decisionLevel() - i));
		}
		c = Clause_new(out_learnt2, true);
		rtrail.last().push(c);
	}

	if (so.ldsb && !ldsb.processImpl(c)) {
		engine.async_fail = true;
	}

	if (static_cast<int>(learnts.size()) >= so.nof_learnts ||
			learnts_literals >= so.learnts_mlimit / 4) {
		reduceDB();
	}
}